

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatParser_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::SamFormatParser::Parse(SamFormatParser *this,string *headerText)

{
  bool bVar1;
  ulong uVar2;
  istream *piVar3;
  string *in_RSI;
  string headerLine;
  istringstream headerStream;
  SamHeader *in_stack_fffffffffffffe30;
  string local_1b0 [32];
  istringstream local_190 [8];
  string *in_stack_fffffffffffffe78;
  SamFormatParser *in_stack_fffffffffffffe80;
  
  SamHeader::Clear(in_stack_fffffffffffffe30);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::istringstream::istringstream(local_190,in_RSI,_S_in);
    std::__cxx11::string::string(local_1b0);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_190,local_1b0);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      ParseSamLine(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::istringstream::~istringstream(local_190);
  }
  return;
}

Assistant:

void SamFormatParser::Parse(const std::string& headerText)
{

    // clear header's prior contents
    m_header.Clear();

    // empty header is OK, but skip processing
    if (headerText.empty()) {
        return;
    }

    // other wise parse SAM lines
    std::istringstream headerStream(headerText);
    std::string headerLine;
    while (std::getline(headerStream, headerLine)) {
        ParseSamLine(headerLine);
    }
}